

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O2

void __thiscall SpriteBase::~SpriteBase(SpriteBase *this)

{
  (this->super_Sprite)._vptr_Sprite = (_func_int **)&PTR_get_data_00152918;
  if (this->data != (uint8_t *)0x0) {
    operator_delete__(this->data);
    this->data = (uint8_t *)0x0;
  }
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
              super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

SpriteBase::~SpriteBase() {
  if (data != nullptr) {
    delete[] data;
    data = nullptr;
  }
}